

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

bool PrepareArgumentsForFunctionCall
               (ExpressionContext *ctx,SynBase *source,ArrayView<ArgumentData> functionArguments,
               ArrayView<ArgumentData> arguments,SmallArray<CallArgumentData,_16U> *result,
               uint *extraRating,bool prepareValues)

{
  undefined4 *puVar1;
  uint uVar2;
  SynIdentifier *pSVar3;
  TypeBase *pTVar4;
  SynBase *source_00;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  int iVar10;
  SynIdentifier **ppSVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeUnsizedArray *type;
  CallArgumentData *pCVar12;
  TypeUnsizedArray *pTVar13;
  undefined4 extraout_var_01;
  TypeArray *pTVar14;
  undefined4 extraout_var_02;
  ExprBase *pEVar15;
  uint uVar16;
  ulong uVar17;
  ArgumentData *pAVar18;
  ExprBase **ppEVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  ArgumentData *pAVar23;
  ulong uVar24;
  uint uVar25;
  TypeBase **ppTVar26;
  ulong uVar27;
  long lVar28;
  ArrayView<ArgumentData> arguments_00;
  IntrusiveList<ExprBase> values;
  TypeBase **local_90;
  IntrusiveList<ExprBase> local_58;
  SynIdentifier **local_48;
  ArrayView<ArgumentData> local_40;
  
  pAVar18 = functionArguments.data;
  pAVar23 = arguments.data;
  uVar16 = functionArguments.count;
  result->count = 0;
  uVar21 = 0;
  uVar25 = arguments.count;
  local_40.data = pAVar18;
  local_40.count = uVar16;
  if (uVar25 != 0) {
    uVar17 = (ulong)uVar25;
    if (pAVar23->name == (SynIdentifier *)0x0) {
      ppSVar11 = &pAVar23[1].name;
      uVar27 = 1;
      do {
        uVar24 = uVar27;
        if (uVar17 == uVar24) break;
        pSVar3 = *ppSVar11;
        ppSVar11 = ppSVar11 + 6;
        uVar27 = uVar24 + 1;
      } while (pSVar3 == (SynIdentifier *)0x0);
      if (uVar17 <= uVar24) {
        uVar21 = 0;
        if (uVar25 != 0) {
          lVar28 = 0;
          uVar21 = 0;
          do {
            puVar1 = (undefined4 *)((long)&pAVar23->type + lVar28);
            uVar5 = *puVar1;
            uVar6 = puVar1[1];
            uVar7 = puVar1[2];
            uVar8 = puVar1[3];
            if (uVar21 == result->max) {
              SmallArray<CallArgumentData,_16U>::grow(result,uVar21);
            }
            if (result->data == (CallArgumentData *)0x0) goto LAB_001ec905;
            uVar25 = result->count;
            uVar21 = uVar25 + 1;
            result->count = uVar21;
            pCVar12 = result->data + uVar25;
            *(undefined4 *)&pCVar12->type = uVar5;
            *(undefined4 *)((long)&pCVar12->type + 4) = uVar6;
            *(undefined4 *)&pCVar12->value = uVar7;
            *(undefined4 *)((long)&pCVar12->value + 4) = uVar8;
            lVar28 = lVar28 + 0x30;
          } while (uVar17 * 0x30 != lVar28);
        }
        goto LAB_001ec4a2;
      }
    }
    arguments_00._12_4_ = 0;
    arguments_00.data = (ArgumentData *)SUB128(arguments._0_12_,0);
    arguments_00.count = SUB124(arguments._0_12_,8);
    bVar9 = HasMatchingArgumentNames(&local_40,arguments_00);
    if (!bVar9) {
      return false;
    }
    uVar21 = result->count;
    ppTVar26 = &pAVar23->type;
    uVar27 = uVar17;
    do {
      if ((SynIdentifier *)ppTVar26[-1] != (SynIdentifier *)0x0) break;
      uVar5 = *(undefined4 *)ppTVar26;
      uVar6 = *(undefined4 *)((long)ppTVar26 + 4);
      uVar7 = *(undefined4 *)(ppTVar26 + 1);
      uVar8 = *(undefined4 *)((long)ppTVar26 + 0xc);
      if (uVar21 == result->max) {
        SmallArray<CallArgumentData,_16U>::grow(result,uVar21);
      }
      if (result->data == (CallArgumentData *)0x0) goto LAB_001ec905;
      uVar22 = result->count;
      uVar21 = uVar22 + 1;
      result->count = uVar21;
      pCVar12 = result->data + uVar22;
      *(undefined4 *)&pCVar12->type = uVar5;
      *(undefined4 *)((long)&pCVar12->type + 4) = uVar6;
      *(undefined4 *)&pCVar12->value = uVar7;
      *(undefined4 *)((long)&pCVar12->value + 4) = uVar8;
      ppTVar26 = ppTVar26 + 6;
      uVar27 = uVar27 - 1;
    } while (uVar27 != 0);
    iVar20 = uVar16 - uVar21;
    uVar22 = uVar21;
    if (uVar21 <= uVar16 && iVar20 != 0) {
      do {
        if (uVar22 == result->max) {
          SmallArray<CallArgumentData,_16U>::grow(result,uVar22);
        }
        if (result->data == (CallArgumentData *)0x0) goto LAB_001ec905;
        uVar2 = result->count;
        uVar22 = uVar2 + 1;
        result->count = uVar22;
        pCVar12 = result->data + uVar2;
        pCVar12->type = (TypeBase *)0x0;
        pCVar12->value = (ExprBase *)0x0;
        iVar20 = iVar20 + -1;
      } while (iVar20 != 0);
    }
    uVar27 = (ulong)uVar16;
    if (uVar21 < uVar25) {
      uVar24 = (ulong)uVar21;
      local_48 = &pAVar18->name;
      do {
        if (pAVar23[uVar24].name != (SynIdentifier *)0x0 && uVar16 != 0) {
          lVar28 = 0;
          uVar25 = 0;
          ppSVar11 = local_48;
          do {
            if ((*ppSVar11 != (SynIdentifier *)0x0) &&
               (bVar9 = InplaceStr::operator==(&(*ppSVar11)->name,&(pAVar23[uVar24].name)->name),
               bVar9)) {
              if (result->count <= uVar25) goto LAB_001ec924;
              pCVar12 = result->data;
              pEVar15 = pAVar23[uVar24].value;
              if (*(long *)((long)&pCVar12->type + lVar28) != 0) {
                anon_unknown.dwarf_1117a3::Stop
                          (ctx,pEVar15->source,"ERROR: argument \'%.*s\' is already set",
                           (ulong)(uint)(*(int *)&((pAVar23[uVar24].name)->name).end -
                                        (int)((pAVar23[uVar24].name)->name).begin));
              }
              *(TypeBase **)((long)&pCVar12->type + lVar28) = pAVar23[uVar24].type;
              *(ExprBase **)((long)&pCVar12->value + lVar28) = pEVar15;
              break;
            }
            uVar25 = uVar25 + 1;
            lVar28 = lVar28 + 0x10;
            ppSVar11 = ppSVar11 + 6;
          } while (uVar27 << 4 != lVar28);
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 != uVar17);
    }
    if (uVar16 != 0) {
      uVar17 = (ulong)result->count;
      ppEVar19 = &pAVar18->value;
      lVar28 = 8;
      uVar24 = 0;
      do {
        if (uVar17 <= uVar24) goto LAB_001ec924;
        if ((*(long *)((long)result->data + lVar28 + -8) == 0) &&
           (pEVar15 = *ppEVar19, pEVar15 != (ExprBase *)0x0)) {
          pTVar4 = pEVar15->type;
          iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          ExprPassthrough::ExprPassthrough
                    ((ExprPassthrough *)CONCAT44(extraout_var,iVar20),pEVar15->source,pEVar15->type,
                     pEVar15);
          uVar17 = (ulong)result->count;
          if (uVar17 <= uVar24) goto LAB_001ec924;
          pCVar12 = result->data;
          *(TypeBase **)((long)pCVar12 + lVar28 + -8) = pTVar4;
          *(ExprPassthrough **)((long)&pCVar12->type + lVar28) =
               (ExprPassthrough *)CONCAT44(extraout_var,iVar20);
        }
        uVar24 = uVar24 + 1;
        lVar28 = lVar28 + 0x10;
        ppEVar19 = ppEVar19 + 6;
      } while (uVar27 != uVar24);
    }
    if (uVar21 < uVar16) {
      uVar17 = (ulong)uVar21;
      uVar25 = result->count;
      if (result->count < uVar21) {
        uVar25 = uVar21;
      }
      pCVar12 = result->data + uVar17;
      do {
        if (uVar25 == uVar17) {
LAB_001ec924:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<CallArgumentData, 16>::operator[](unsigned int) [T = CallArgumentData, N = 16]"
                       );
        }
        if (pCVar12->type == (TypeBase *)0x0) {
          return false;
        }
        uVar17 = uVar17 + 1;
        pCVar12 = pCVar12 + 1;
      } while (uVar27 != uVar17);
    }
    goto LAB_001ec880;
  }
LAB_001ec4a2:
  iVar20 = uVar16 - uVar21;
  if (uVar21 <= uVar16 && iVar20 != 0) {
    ppEVar19 = &pAVar18[uVar21].value;
    do {
      pEVar15 = *ppEVar19;
      if (pEVar15 != (ExprBase *)0x0) {
        pTVar4 = pEVar15->type;
        iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        ExprPassthrough::ExprPassthrough
                  ((ExprPassthrough *)CONCAT44(extraout_var_00,iVar10),pEVar15->source,pEVar15->type
                   ,pEVar15);
        if (result->count == result->max) {
          SmallArray<CallArgumentData,_16U>::grow(result,result->count);
        }
        pCVar12 = result->data;
        if (pCVar12 == (CallArgumentData *)0x0) {
LAB_001ec905:
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<CallArgumentData, 16>::push_back(const T &) [T = CallArgumentData, N = 16]"
                       );
        }
        uVar21 = result->count;
        result->count = uVar21 + 1;
        pCVar12[uVar21].type = pTVar4;
        pCVar12[uVar21].value = (ExprBase *)CONCAT44(extraout_var_00,iVar10);
      }
      ppEVar19 = ppEVar19 + 6;
      iVar20 = iVar20 + -1;
    } while (iVar20 != 0);
  }
  type = ExpressionContext::GetUnsizedArrayType(ctx,&ctx->typeAutoRef->super_TypeBase);
  if (uVar16 == 0) {
    return result->count == 0;
  }
  uVar21 = uVar16 - 1;
  uVar17 = (ulong)uVar21;
  if ((((TypeUnsizedArray *)pAVar18[uVar17].type != type) || (pAVar18[uVar17].isExplicit != false))
     || (uVar25 = result->count, uVar25 < uVar21)) goto LAB_001ec880;
  if (uVar25 == uVar16) {
    pCVar12 = SmallArray<CallArgumentData,_16U>::back(result);
    if ((TypeUnsizedArray *)pCVar12->type == type) goto LAB_001ec880;
    uVar25 = result->count;
  }
  if (extraRating != (uint *)0x0) {
    *extraRating = (uVar25 + ~uVar16) * 5 + 10;
    uVar25 = result->count;
  }
  if (prepareValues) {
    if (uVar25 != 0) {
      source = result->data->value->source;
    }
    local_58.head = (ExprBase *)0x0;
    local_58.tail = (ExprBase *)0x0;
    if (uVar21 < uVar25) {
      uVar27 = uVar17 << 4 | 8;
      do {
        pEVar15 = *(ExprBase **)((long)&result->data->type + uVar27);
        pTVar4 = pEVar15->type;
        if ((pTVar4 != (TypeBase *)0x0) && (pTVar4->typeID == 0x13)) {
          source_00 = pEVar15->source;
          pTVar13 = ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)pTVar4[1]._vptr_TypeBase)
          ;
          pEVar15 = CreateCast(ctx,source_00,pEVar15,(TypeBase *)pTVar13,false);
        }
        pEVar15 = CreateCast(ctx,pEVar15->source,pEVar15,&ctx->typeAutoRef->super_TypeBase,true);
        IntrusiveList<ExprBase>::push_back(&local_58,pEVar15);
        uVar17 = uVar17 + 1;
        uVar27 = uVar27 + 0x10;
      } while (uVar17 < result->count);
      if ((TypeUnsizedArray *)local_58.head == (TypeUnsizedArray *)0x0) goto LAB_001ec7dd;
      iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar15 = (ExprBase *)CONCAT44(extraout_var_01,iVar20);
      uVar17 = 0;
      pTVar13 = (TypeUnsizedArray *)local_58.head;
      if ((TypeUnsizedArray *)local_58.head != (TypeUnsizedArray *)0x0) {
        do {
          uVar25 = (int)uVar17 + 1;
          uVar17 = (ulong)uVar25;
          pTVar13 = (TypeUnsizedArray *)(pTVar13->super_TypeStruct).super_TypeBase.importModule;
        } while (pTVar13 != (TypeUnsizedArray *)0x0);
        uVar17 = (ulong)uVar25;
      }
      pTVar14 = ExpressionContext::GetArrayType(ctx,&ctx->typeAutoRef->super_TypeBase,uVar17);
      pEVar15->typeID = 0xf;
      pEVar15->source = source;
      pEVar15->type = &pTVar14->super_TypeBase;
      pEVar15->next = (ExprBase *)0x0;
      pEVar15->listed = false;
      pEVar15->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6710;
      pEVar15[1]._vptr_ExprBase = (_func_int **)local_58.head;
      *(ExprBase **)&pEVar15[1].typeID = local_58.tail;
    }
    else {
LAB_001ec7dd:
      iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pEVar15 = (ExprBase *)CONCAT44(extraout_var_02,iVar20);
      pTVar4 = ctx->typeNullPtr;
      pEVar15->typeID = 9;
      pEVar15->source = source;
      pEVar15->type = pTVar4;
      pEVar15->next = (ExprBase *)0x0;
      pEVar15->listed = false;
      pEVar15->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e65c0;
    }
    pEVar15 = CreateCast(ctx,source,pEVar15,(TypeBase *)type,true);
    uVar25 = result->count;
  }
  else {
    pEVar15 = (ExprBase *)0x0;
  }
  if (uVar25 < uVar21) {
    __assert_fail("newSize <= count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x1a8,
                  "void SmallArray<CallArgumentData, 16>::shrink(unsigned int) [T = CallArgumentData, N = 16]"
                 );
  }
  result->count = uVar21;
  local_58.head = (ExprBase *)type;
  local_58.tail = pEVar15;
  SmallArray<CallArgumentData,_16U>::push_back(result,(CallArgumentData *)&local_58);
LAB_001ec880:
  bVar9 = result->count == uVar16;
  if ((prepareValues && bVar9) && (bVar9 = true, uVar16 != 0)) {
    local_90 = &pAVar18->type;
    lVar28 = 8;
    uVar17 = 0;
    do {
      pCVar12 = result->data;
      pEVar15 = *(ExprBase **)((long)&pCVar12->type + lVar28);
      if (pEVar15 == (ExprBase *)0x0) {
        __assert_fail("argument.value",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1685,
                      "bool PrepareArgumentsForFunctionCall(ExpressionContext &, SynBase *, ArrayView<ArgumentData>, ArrayView<ArgumentData>, SmallArray<CallArgumentData, 16> &, unsigned int *, bool)"
                     );
      }
      pEVar15 = CreateCast(ctx,pEVar15->source,pEVar15,*local_90,true);
      *(ExprBase **)((long)&pCVar12->type + lVar28) = pEVar15;
      uVar17 = uVar17 + 1;
      lVar28 = lVar28 + 0x10;
      local_90 = local_90 + 6;
    } while (uVar17 < result->count);
    bVar9 = true;
  }
  return bVar9;
}

Assistant:

bool PrepareArgumentsForFunctionCall(ExpressionContext &ctx, SynBase *source, ArrayView<ArgumentData> functionArguments, ArrayView<ArgumentData> arguments, SmallArray<CallArgumentData, 16> &result, unsigned *extraRating, bool prepareValues)
{
	result.clear();

	if(HasNamedCallArguments(arguments))
	{
		if(!HasMatchingArgumentNames(functionArguments, arguments))
			return false;

		// Add first unnamed arguments
		for(unsigned i = 0; i < arguments.count; i++)
		{
			ArgumentData &argument = arguments.data[i];

			if(!argument.name)
				result.push_back(CallArgumentData(argument.type, argument.value));
			else
				break;
		}

		unsigned unnamedCount = result.size();

		// Reserve slots for all remaining arguments
		for(unsigned i = unnamedCount; i < functionArguments.count; i++)
			result.push_back(CallArgumentData(NULL, NULL));

		// Put named arguments in appropriate slots
		for(unsigned i = unnamedCount; i < arguments.count; i++)
		{
			ArgumentData &argument = arguments.data[i];

			if(!argument.name)
				continue;

			unsigned targetPos = 0;

			for(unsigned k = 0; k < functionArguments.count; k++)
			{
				ArgumentData &functionArgument = functionArguments.data[k];

				if(functionArgument.name && functionArgument.name->name == argument.name->name)
				{
					if(result[targetPos].type != NULL)
						Stop(ctx, argument.value->source, "ERROR: argument '%.*s' is already set", FMT_ISTR(argument.name->name));

					result[targetPos] = CallArgumentData(argument.type, argument.value);
					break;
				}

				targetPos++;
			}
		}

		// Fill in any unset arguments with default values
		for(unsigned i = 0; i < functionArguments.count; i++)
		{
			ArgumentData &argument = functionArguments.data[i];

			if(result[i].type == NULL)
			{
				if(ExprBase *value = argument.value)
					result[i] = CallArgumentData(value->type, new (ctx.get<ExprPassthrough>()) ExprPassthrough(value->source, value->type, value));
			}
		}

		// All arguments must be set
		for(unsigned i = unnamedCount; i < functionArguments.count; i++)
		{
			if(result[i].type == NULL)
				return false;
		}
	}
	else
	{
		// Add arguments
		for(unsigned i = 0; i < arguments.count; i++)
		{
			ArgumentData &argument = arguments.data[i];

			result.push_back(CallArgumentData(argument.type, argument.value));
		}

		// Add any arguments with default values
		for(unsigned i = result.count; i < functionArguments.count; i++)
		{
			ArgumentData &argument = functionArguments.data[i];

			if(ExprBase *value = argument.value)
				result.push_back(CallArgumentData(value->type, new (ctx.get<ExprPassthrough>()) ExprPassthrough(value->source, value->type, value)));
		}

		// Create variadic pack if neccessary
		TypeBase *varArgType = ctx.GetUnsizedArrayType(ctx.typeAutoRef);

		if(!functionArguments.empty() && functionArguments.back().type == varArgType && !functionArguments.back().isExplicit)
		{
			if(result.size() >= functionArguments.size() - 1 && !(result.size() == functionArguments.size() && result.back().type == varArgType))
			{
				if(extraRating)
					*extraRating = 10 + (result.size() - functionArguments.size() - 1) * 5;

				ExprBase *value = NULL;

				if(prepareValues)
				{
					if(!result.empty())
						source = result[0].value->source;

					IntrusiveList<ExprBase> values;

					for(unsigned i = functionArguments.size() - 1; i < result.size(); i++)
					{
						ExprBase *value = result[i].value;

						if(TypeArray *arrType = getType<TypeArray>(value->type))
						{
							// type[N] is converted to type[] first
							value = CreateCast(ctx, value->source, value, ctx.GetUnsizedArrayType(arrType->subType), false);
						}

						values.push_back(CreateCast(ctx, value->source, value, ctx.typeAutoRef, true));
					}

					if(values.empty())
						value = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, ctx.typeNullPtr);
					else
						value = new (ctx.get<ExprArray>()) ExprArray(source, ctx.GetArrayType(ctx.typeAutoRef, values.size()), values);

					value = CreateCast(ctx, source, value, varArgType, true);
				}

				result.shrink(functionArguments.size() - 1);
				result.push_back(CallArgumentData(varArgType, value));
			}
		}
	}

	if(result.size() != functionArguments.size())
		return false;

	// Convert all arguments to target type if this is a real call
	if(prepareValues)
	{
		for(unsigned i = 0; i < result.count; i++)
		{
			CallArgumentData &argument = result.data[i];

			assert(argument.value);

			TypeBase *target = functionArguments.data[i].type;

			argument.value = CreateCast(ctx, argument.value->source, argument.value, target, true);
		}
	}

	return true;
}